

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O3

void MatchFinder_Init(void *_p)

{
  void *__s;
  
  __s = *(void **)((long)_p + 0x28);
  memset((void *)((long)__s + (ulong)*(uint *)((long)_p + 0x6c) * 4),0,
         (ulong)*(uint *)((long)_p + 0x38) * 4 + 4);
  if ((ulong)*(uint *)((long)_p + 0x6c) != 0) {
    memset(__s,0,(ulong)*(uint *)((long)_p + 0x6c) << 2);
  }
  if (*(char *)((long)_p + 0x23) == '\0') {
    *(undefined8 *)_p = *(undefined8 *)((long)_p + 0x40);
  }
  *(undefined4 *)((long)_p + 0x10) = 1;
  *(undefined4 *)((long)_p + 8) = 1;
  *(undefined4 *)((long)_p + 0x74) = 0;
  *(undefined1 *)((long)_p + 0x20) = 0;
  MatchFinder_ReadBlock((CMatchFinder *)_p);
  *(undefined4 *)((long)_p + 0x18) = *(undefined4 *)((long)_p + 8);
  MatchFinder_SetLimits((CMatchFinder *)_p);
  return;
}

Assistant:

void MatchFinder_Init(void *_p)
{
  CMatchFinder *p = (CMatchFinder *)_p;
  MatchFinder_Init_HighHash(p);
  MatchFinder_Init_LowHash(p);
  MatchFinder_Init_4(p);
  // if (readData)
  MatchFinder_ReadBlock(p);

  /* if we init (cyclicBufferPos = pos), then we can use one variable
     instead of both (cyclicBufferPos) and (pos) : only before (cyclicBufferPos) wrapping */
  p->cyclicBufferPos = (p->pos - CYC_TO_POS_OFFSET); // init with relation to (pos)
  // p->cyclicBufferPos = 0; // smallest value
  // p->son[0] = p->son[1] = 0; // unused: we can init skipped record for speculated accesses.
  MatchFinder_SetLimits(p);
}